

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void map_init_emacs(EditLine *el)

{
  el_action_t *peVar1;
  el_action_t *peVar2;
  el_action_t *peVar3;
  EditLine *el_00;
  keymacro_value_t *val;
  el_action_t *emacs;
  el_action_t *alt;
  el_action_t *key;
  wchar_t buf [3];
  wchar_t i;
  EditLine *el_local;
  
  peVar1 = (el->el_map).key;
  peVar2 = (el->el_map).alt;
  peVar3 = (el->el_map).emacs;
  (el->el_map).type = L'\0';
  (el->el_map).current = (el->el_map).key;
  unique0x1000012c = el;
  keymacro_reset(el);
  for (buf[1] = L'\0'; buf[1] < L'Ā'; buf[1] = buf[1] + L'\x01') {
    peVar1[buf[1]] = peVar3[buf[1]];
    peVar2[buf[1]] = '\x1c';
  }
  map_init_meta(stack0xfffffffffffffff0);
  map_init_nls(stack0xfffffffffffffff0);
  el_00 = stack0xfffffffffffffff0;
  key._0_4_ = 0x18;
  key._4_4_ = 0x18;
  buf[0] = L'\0';
  val = keymacro_map_cmd(stack0xfffffffffffffff0,L'#');
  keymacro_add(el_00,(wchar_t *)&key,val,L'\0');
  tty_bind_char(stack0xfffffffffffffff0,L'\x01');
  terminal_bind_arrow(stack0xfffffffffffffff0);
  return;
}

Assistant:

libedit_private void
map_init_emacs(EditLine *el)
{
	int i;
	wchar_t buf[3];
	el_action_t *key = el->el_map.key;
	el_action_t *alt = el->el_map.alt;
	const el_action_t *emacs = el->el_map.emacs;

	el->el_map.type = MAP_EMACS;
	el->el_map.current = el->el_map.key;
	keymacro_reset(el);

	for (i = 0; i < N_KEYS; i++) {
		key[i] = emacs[i];
		alt[i] = ED_UNASSIGNED;
	}

	map_init_meta(el);
	map_init_nls(el);

	buf[0] = CONTROL('X');
	buf[1] = CONTROL('X');
	buf[2] = 0;
	keymacro_add(el, buf, keymacro_map_cmd(el, EM_EXCHANGE_MARK), XK_CMD);

	tty_bind_char(el, 1);
	terminal_bind_arrow(el);
}